

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O0

void __thiscall
TEST_JUnitOutputTest_testFailureWithNewlineInIt_Test::testBody
          (TEST_JUnitOutputTest_testFailureWithNewlineInIt_Test *this)

{
  JUnitTestOutputTestRunner *pJVar1;
  FileForJUnitOutputTests *pFVar2;
  UtestShell *pUVar3;
  char *pcVar4;
  TestTerminator *pTVar5;
  TEST_JUnitOutputTest_testFailureWithNewlineInIt_Test *this_local;
  
  pJVar1 = JUnitTestOutputTestRunner::start
                     ((this->super_TEST_GROUP_CppUTestGroupJUnitOutputTest).testCaseRunner);
  pJVar1 = JUnitTestOutputTestRunner::withGroup(pJVar1,"testGroupWithFailingTest");
  pJVar1 = JUnitTestOutputTestRunner::withTest(pJVar1,"FailingTestName");
  pJVar1 = JUnitTestOutputTestRunner::thatFails(pJVar1,"Test \nfailed","thisfile",10);
  JUnitTestOutputTestRunner::end(pJVar1);
  pFVar2 = FileSystemForJUnitTestOutputTests::file
                     (&fileSystem,"cpputest_testGroupWithFailingTest.xml");
  (this->super_TEST_GROUP_CppUTestGroupJUnitOutputTest).outputFile = pFVar2;
  pUVar3 = UtestShell::getCurrent();
  pcVar4 = FileForJUnitOutputTests::line
                     ((this->super_TEST_GROUP_CppUTestGroupJUnitOutputTest).outputFile,6);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[9])
            (pUVar3,
             "<failure message=\"thisfile:10: Test {newline}failed\" type=\"AssertionFailedError\">\n"
             ,pcVar4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/JUnitOutputTest.cpp"
             ,0x223,pTVar5);
  return;
}

Assistant:

TEST(JUnitOutputTest, testFailureWithNewlineInIt)
{
    testCaseRunner->start()
            .withGroup("testGroupWithFailingTest")
                .withTest("FailingTestName").thatFails("Test \nfailed", "thisfile", 10)
            .end();

    outputFile = fileSystem.file("cpputest_testGroupWithFailingTest.xml");

    STRCMP_EQUAL("<failure message=\"thisfile:10: Test {newline}failed\" type=\"AssertionFailedError\">\n", outputFile->line(6));
}